

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_1::PosixRandomAccessFile::PosixRandomAccessFile
          (PosixRandomAccessFile *this,string *filename,int fd,Limiter *fd_limiter)

{
  long lVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  int in_EDX;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  RandomAccessFile *in_stack_ffffffffffffff98;
  int local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  RandomAccessFile::RandomAccessFile(in_stack_ffffffffffffff98);
  *in_RDI = &PTR__PosixRandomAccessFile_01618560;
  bVar2 = Limiter::Acquire((Limiter *)in_stack_ffffffffffffffd0);
  *(bool *)(in_RDI + 1) = bVar2;
  local_54 = in_EDX;
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    local_54 = -1;
  }
  *(int *)((long)in_RDI + 0xc) = local_54;
  in_RDI[2] = in_RCX;
  std::__cxx11::string::string(in_RCX,in_stack_ffffffffffffffd0);
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    if (*(int *)((long)in_RDI + 0xc) != -1) {
      __assert_fail("fd_ == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/env_posix.cc"
                    ,0xa0,
                    "leveldb::(anonymous namespace)::PosixRandomAccessFile::PosixRandomAccessFile(std::string, int, Limiter *)"
                   );
    }
    close(in_EDX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

PosixRandomAccessFile(std::string filename, int fd, Limiter* fd_limiter)
      : has_permanent_fd_(fd_limiter->Acquire()),
        fd_(has_permanent_fd_ ? fd : -1),
        fd_limiter_(fd_limiter),
        filename_(std::move(filename)) {
    if (!has_permanent_fd_) {
      assert(fd_ == -1);
      ::close(fd);  // The file will be opened on every read.
    }
  }